

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O2

Privkey * cfd::core::Privkey::GenerageRandomKey(void)

{
  int iVar1;
  Privkey *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> privkey;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  privkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  privkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  privkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  do {
    RandomNumberUtil::GetRandomBytes
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38,0x20);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(&privkey,&local_38)
    ;
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
    iVar1 = wally_ec_private_key_verify
                      (privkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (long)privkey.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)privkey.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
  } while (iVar1 != 0);
  ByteData::ByteData((ByteData *)&local_38,&privkey);
  Privkey(in_RDI,(ByteData *)&local_38,kMainnet,true);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&privkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return in_RDI;
}

Assistant:

Privkey Privkey::GenerageRandomKey() {
  std::vector<uint8_t> privkey;
  int ret = WALLY_OK;

  do {
    privkey = RandomNumberUtil::GetRandomBytes(kPrivkeySize);
    ret = wally_ec_private_key_verify(privkey.data(), privkey.size());
  } while (ret != WALLY_OK);

  return Privkey(ByteData(privkey));
}